

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O0

bool __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase
          (torrent_list<libtorrent::aux::torrent> *this,info_hash_t *ih)

{
  anon_class_16_2_f7cad86f f;
  bool bVar1;
  reference __a;
  reference __b;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_68;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_60;
  torrent **local_58;
  shared_ptr<libtorrent::aux::torrent> *local_50;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_48;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  array_iter;
  torrent *local_28;
  torrent *found;
  info_hash_t *ih_local;
  torrent_list<libtorrent::aux::torrent> *this_local;
  
  local_28 = (torrent *)0x0;
  f.found = &local_28;
  f.this = this;
  array_iter._M_current = (shared_ptr<libtorrent::aux::torrent> *)this;
  found = (torrent *)ih;
  ih_local = (info_hash_t *)this;
  info_hash_t::
  for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase(libtorrent::info_hash_t_const&)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_1_>
            (ih,f);
  if (local_28 == (torrent *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_48._M_current =
         (shared_ptr<libtorrent::aux::torrent> *)
         ::std::
         vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
         ::begin(&this->m_array);
    local_50 = (shared_ptr<libtorrent::aux::torrent> *)
               ::std::
               vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
               ::end(&this->m_array);
    local_58 = &local_28;
    local_40 = ::std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase(libtorrent::info_hash_t_const&)::_lambda(std::shared_ptr<libtorrent::aux::torrent>const&)_1_>
                         (local_48,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                    )local_50,(anon_class_8_1_a7eb86a2_for__M_pred)local_58);
    local_68._M_current =
         (shared_ptr<libtorrent::aux::torrent> *)
         ::std::
         vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
         ::end(&this->m_array);
    local_60 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
               ::operator-(&local_68,1);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_60);
    if (bVar1) {
      __a = __gnu_cxx::
            __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
            ::operator*(&local_40);
      __b = ::std::
            vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
            ::back(&this->m_array);
      ::std::swap<libtorrent::aux::torrent>(__a,__b);
    }
    ::std::
    vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
    ::pop_back(&this->m_array);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool erase(info_hash_t const& ih)
	{
		INVARIANT_CHECK;

		T* found = nullptr;
		ih.for_each([&](sha1_hash const& hash, protocol_version)
		{
			auto const i = m_index.find(hash);
			if (i != m_index.end())
			{
				TORRENT_ASSERT(found == nullptr || found == i->second);
				found = i->second;
				m_index.erase(i);
			}

#if !defined TORRENT_DISABLE_ENCRYPTION
			static char const req2[4] = { 'r', 'e', 'q', '2' };
			hasher h(req2);
			h.update(hash);
			m_obfuscated_index.erase(h.final());
#endif
		});
		if (!found) return false;

		auto const array_iter = std::find_if(m_array.begin(), m_array.end()
			, [&](std::shared_ptr<T> const& p) { return p.get() == found; });
		TORRENT_ASSERT(array_iter != m_array.end());

		TORRENT_ASSERT(m_index.find(ih.v1) == m_index.end());

		if (array_iter != m_array.end() - 1)
			std::swap(*array_iter, m_array.back());

		// This is where we, potentially, remove the last reference
		m_array.pop_back();

		return true;
	}